

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.hpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySubImage3D::~TextureCubeMapArraySubImage3D
          (TextureCubeMapArraySubImage3D *this)

{
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeMapArraySubImage3D_01dfc998;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_expected_data_buffer).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_copy_data_buffer).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  TestCaseBase::~TestCaseBase(&this->super_TestCaseBase);
  return;
}

Assistant:

virtual ~TextureCubeMapArraySubImage3D()
	{
	}